

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

void getn(stbi *s,stbi_uc *buffer,int n)

{
  int n_local;
  stbi_uc *buffer_local;
  stbi *s_local;
  
  if (s->img_file == (FILE *)0x0) {
    memcpy(buffer,s->img_buffer,(long)n);
    s->img_buffer = s->img_buffer + n;
  }
  else {
    fread(buffer,1,(long)n,(FILE *)s->img_file);
  }
  return;
}

Assistant:

static void getn(stbi *s, stbi_uc *buffer, int n)
{
#ifndef STBI_NO_STDIO
   if (s->img_file) {
      fread(buffer, 1, n, s->img_file);
      return;
   }
#endif
   memcpy(buffer, s->img_buffer, n);
   s->img_buffer += n;
}